

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2926b4::TestCallback::fromApp
          (TestCallback *this,Message *message,SessionID *param_2)

{
  bool bVar1;
  FieldMap *this_00;
  UnsupportedMessageType *this_01;
  allocator<char> local_a9;
  string local_a8;
  undefined1 local_78 [8];
  MsgType msgType;
  SessionID *param_2_local;
  Message *message_local;
  TestCallback *this_local;
  
  msgType.super_StringField.super_FieldBase.m_metrics = (field_metrics)param_2;
  FIX::MsgType::MsgType((MsgType *)local_78);
  this_00 = &FIX::Message::getHeader(message)->super_FieldMap;
  FIX::FieldMap::getField(this_00,(FieldBase *)local_78);
  bVar1 = FIX::operator==((StringField *)local_78,"8");
  if (!bVar1) {
    FIX::MsgType::~MsgType((MsgType *)local_78);
    return;
  }
  this_01 = (UnsupportedMessageType *)__cxa_allocate_exception(0x50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"",&local_a9);
  FIX::UnsupportedMessageType::UnsupportedMessageType(this_01,&local_a8);
  __cxa_throw(this_01,&FIX::UnsupportedMessageType::typeinfo,
              FIX::UnsupportedMessageType::~UnsupportedMessageType);
}

Assistant:

EXCEPT(FieldNotFound, IncorrectDataFormat, IncorrectTagValue, UnsupportedMessageType) {
    MsgType msgType;
    message.getHeader().getField(msgType);
    if (msgType == "8") {
      throw UnsupportedMessageType();
    }
  }